

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::Parse(Parser *this,string *fn)

{
  bool condition;
  int iVar1;
  clock_t cVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  clock_t cVar5;
  long *plVar6;
  undefined4 extraout_var;
  size_type *psVar7;
  TiXmlNode *pTVar8;
  Parser *this_00;
  TiXmlHandle xml_handle;
  string msg;
  TiXmlDocument doc;
  allocator<char> local_181;
  TiXmlHandle local_180;
  long local_178;
  undefined1 local_170 [16];
  TiXmlHandle local_160;
  TiXmlNode *local_158;
  undefined1 local_150 [16];
  TiXmlNode *local_140;
  TiXmlString local_138;
  undefined1 local_130 [16];
  TiXmlNode **local_120;
  TiXmlNode *local_118;
  TiXmlNode *local_110 [2];
  TiXmlNode *local_100;
  TiXmlString local_f8;
  undefined1 local_f0 [24];
  TiXmlNode *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string local_c0;
  TiXmlDocument local_a0;
  
  std::__cxx11::string::_M_assign((string *)this);
  cVar2 = clock();
  util::tinyxml::TiXmlDocument::TiXmlDocument(&local_a0,(this->file_name_)._M_dataplus._M_p);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Loading file ",0xd)
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (&plVar3->super_ostream,(this->file_name_)._M_dataplus._M_p,
                          (this->file_name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"...",3);
    }
  }
  condition = util::tinyxml::TiXmlDocument::LoadFile(&local_a0,TIXML_ENCODING_UNKNOWN);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done [",6);
      cVar5 = clock();
      poVar4 = std::ostream::_M_insert<double>((double)(cVar5 - cVar2) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s]",2);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  to_string<int>(&local_c0,local_a0.errorLocation.row + 1);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x176a9f);
  local_100 = (TiXmlNode *)local_f0;
  pTVar8 = (TiXmlNode *)(plVar6 + 2);
  if ((TiXmlNode *)*plVar6 == pTVar8) {
    local_f0._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_f0._8_8_ = *(TiXmlCursor *)(plVar6 + 3);
  }
  else {
    local_f0._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_100 = (TiXmlNode *)*plVar6;
  }
  local_f8.rep_ = (Rep *)plVar6[1];
  *plVar6 = (long)pTVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  pTVar8 = (TiXmlNode *)(plVar6 + 2);
  if ((TiXmlNode *)*plVar6 == pTVar8) {
    local_130._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_130._8_8_ = *(TiXmlCursor *)(plVar6 + 3);
    local_140 = (TiXmlNode *)local_130;
  }
  else {
    local_130._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_140 = (TiXmlNode *)*plVar6;
  }
  local_138.rep_ = (Rep *)plVar6[1];
  *plVar6 = (long)pTVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(local_a0.errorDesc.rep_)->str,&local_181);
  pTVar8 = (TiXmlNode *)0xf;
  if (local_140 != (TiXmlNode *)local_130) {
    pTVar8 = (TiXmlNode *)local_130._0_8_;
  }
  if (pTVar8 < (TiXmlNode *)((local_138.rep_)->str + (long)&local_118[-1].prev)) {
    pTVar8 = (TiXmlNode *)0xf;
    if (local_120 != local_110) {
      pTVar8 = local_110[0];
    }
    if ((TiXmlNode *)((local_138.rep_)->str + (long)&local_118[-1].prev) <= pTVar8) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_120,0,(char *)0x0,(ulong)local_140);
      goto LAB_0014a73b;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_120);
LAB_0014a73b:
  local_180.node = (TiXmlNode *)local_170;
  pTVar8 = (TiXmlNode *)(plVar6 + 2);
  if ((TiXmlNode *)*plVar6 == pTVar8) {
    local_170._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_170._8_8_ = *(TiXmlCursor *)(plVar6 + 3);
  }
  else {
    local_170._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_180.node = (TiXmlNode *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)pTVar8;
  plVar6[1] = 0;
  *(undefined1 *)&(pTVar8->super_TiXmlBase)._vptr_TiXmlBase = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
  pTVar8 = (TiXmlNode *)(plVar6 + 2);
  if ((TiXmlNode *)*plVar6 == pTVar8) {
    local_150._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_150._8_8_ = plVar6[3];
    local_160.node = (TiXmlNode *)local_150;
  }
  else {
    local_150._0_8_ = (pTVar8->super_TiXmlBase)._vptr_TiXmlBase;
    local_160.node = (TiXmlNode *)*plVar6;
  }
  local_158 = (TiXmlNode *)plVar6[1];
  *plVar6 = (long)pTVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d0._M_allocated_capacity = *psVar7;
    local_d0._8_8_ = plVar6[3];
    local_f0._16_8_ = &local_d0;
  }
  else {
    local_d0._M_allocated_capacity = *psVar7;
    local_f0._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_d8 = (TiXmlNode *)plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Ensure(this,condition,(string *)(local_f0 + 0x10),(TiXmlBase *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._16_8_ != &local_d0) {
    operator_delete((void *)local_f0._16_8_,local_d0._M_allocated_capacity + 1);
  }
  if (local_160.node != (TiXmlNode *)local_150) {
    operator_delete(local_160.node,local_150._0_8_ + 1);
  }
  if (local_180.node != (TiXmlNode *)local_170) {
    operator_delete(local_180.node,local_170._0_8_ + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,(ulong)((long)&(local_110[0]->super_TiXmlBase)._vptr_TiXmlBase + 1));
  }
  if (local_140 != (TiXmlNode *)local_130) {
    operator_delete(local_140,(ulong)((long)&((TiXmlBase *)local_130._0_8_)->_vptr_TiXmlBase + 1));
  }
  if (local_100 != (TiXmlNode *)local_f0) {
    operator_delete(local_100,(ulong)((long)&((TiXmlBase *)local_f0._0_8_)->_vptr_TiXmlBase + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_180.node = &local_a0.super_TiXmlNode;
  util::tinyxml::TiXmlHandle::FirstChildElement(&local_160);
  (*((local_160.node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
  iVar1 = (*((local_160.node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,(char *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x38) + 0x10),
             (allocator<char> *)&local_140);
  cVar2 = clock();
  this_00 = this;
  ParseDiscountTag(this,&local_180);
  ParseHorizonTag(this_00,&local_180);
  ParseHasTerminalTag(this,&local_180);
  ParseVariableTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing terminal tag...",0x17);
    }
  }
  ParseTerminalStateTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done.",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing initial belief...",0x19);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseInitialBeliefTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done.",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing transitions...",0x16);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseStateTransitionTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done.",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing obs function...",0x17);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseObsFunctionTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done.",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing reward function...",0x1a);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseRewardFunctionTag(this,&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done.",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"Parsing done in ",0x10);
      cVar5 = clock();
      poVar4 = std::ostream::_M_insert<double>((double)(cVar5 - cVar2) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  if (local_160.node != (TiXmlNode *)local_150) {
    operator_delete(local_160.node,local_150._0_8_ + 1);
  }
  util::tinyxml::TiXmlDocument::~TiXmlDocument(&local_a0);
  return;
}

Assistant:

void Parser::Parse(string fn) {
	file_name_ = fn;

	clock_t start = clock();
	TiXmlDocument doc(file_name_.c_str());

	// Load file
	logi << "Loading file " << file_name_ << "...";
	bool loadOkay = doc.LoadFile();
	logi << "Done [" << double(clock() - start) / CLOCKS_PER_SEC << "s]"
		<< endl;

	Ensure(loadOkay,
		"Could not load pomdpX file.\n  Line" + to_string(doc.ErrorRow()) + ":"
			+ string(doc.ErrorDesc()) + "\n"
			+ "  Check pomdpX file with pomdpX's XML schema using an XML validator.\n");

	TiXmlHandle xml_handle(&doc);
	TiXmlElement *elem = xml_handle.FirstChildElement().ToElement();
	string msg = elem->Value();

	start = clock();
	// Parse all the tags
	ParseDiscountTag(xml_handle);
	ParseHorizonTag(xml_handle);
	ParseHasTerminalTag(xml_handle);
	ParseVariableTag(xml_handle);
	logi << "Parsing terminal tag...";
	ParseTerminalStateTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing initial belief...";
	logi.flush();
	ParseInitialBeliefTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing transitions...";
	logi.flush();
	ParseStateTransitionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing obs function...";
	logi.flush();
	ParseObsFunctionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing reward function...";
	logi.flush();
	ParseRewardFunctionTag(xml_handle);
	logi << "Done." << endl;
	// cout << "Parsing terminal state reward" << endl;
	// ParseTerminalStateRewardTag(xml_handle);
	// ReadBounds();
	logi << "Parsing done in " << double(clock() - start) / CLOCKS_PER_SEC
		<< "s" << endl;
}